

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::execute(Interpreter *this,bool showExecutionTime)

{
  element_type *ident;
  ostream *poVar1;
  ThrowPacket *this_00;
  allocator<char> local_79;
  vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> local_78;
  ptr<Function> main;
  undefined1 local_48 [32];
  
  ident = (this->object).super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"main",&local_79);
  Object::getFunction((Object *)&main,(Identifier *)ident);
  std::__cxx11::string::~string((string *)&local_78);
  if (main.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::chrono::_V2::system_clock::now();
    local_78.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*((main.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Value).
      super_Member._vptr_Member[9])(local_48 + 0x10);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
    std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::~vector
              (&local_78);
    if (showExecutionTime) {
      std::chrono::_V2::system_clock::now();
      poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar1 = std::operator<<(poVar1,"Executed in ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1," ms");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&main.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"No function named \'main\' is defined",&local_79);
  ExceptionObjects::undefined((string *)local_48);
  ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)local_48);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void Interpreter::execute(bool showExecutionTime) {
    ptr<Function> main = object -> getFunction("main");

    if(!main)
        throw ThrowPacket(ExceptionObjects::undefined("No function named 'main' is defined"));

    auto start = std::chrono::high_resolution_clock::now();

    try {
        ValueList initial = {};
        main -> call(initial);
    } catch(ReturnPacket& returnPacket) {}

    if(showExecutionTime) {
        auto stop = std::chrono::high_resolution_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start);
        std::cout << std::endl << "Executed in " << duration.count() << " ms" << std::endl;
    }
}